

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void uv_sem_destroy(uv_sem_t *sem)

{
  uv_mutex_t *mutex;
  int iVar1;
  
  if (platform_needs_custom_semaphore != 0) {
    mutex = (uv_mutex_t *)sem->__align;
    uv_cond_destroy((uv_cond_t *)(mutex + 1));
    uv_mutex_destroy(mutex);
    uv__free(mutex);
    return;
  }
  iVar1 = sem_destroy((sem_t *)sem);
  if (iVar1 == 0) {
    return;
  }
  abort();
}

Assistant:

void uv_sem_destroy(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_destroy(sem);
  else
    uv__sem_destroy(sem);
}